

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<void> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedRead::writeWithFds
          (BlockedRead *this,ArrayPtr<const_unsigned_char> data,
          ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData,ArrayPtr<const_int> fds)

{
  size_t *psVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  undefined8 uVar6;
  uchar *puVar7;
  undefined8 uVar8;
  BlockedRead *this_00;
  undefined8 uVar9;
  size_t in_R9;
  ulong uVar10;
  int iVar11;
  BlockedRead *pBVar12;
  bool bVar13;
  ArrayPtr<const_unsigned_char> data_00;
  ArrayPtr<const_unsigned_char> data_01;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData_00;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData_01;
  Fault f;
  DebugExpression<bool> _kjCondition;
  OwnFd local_ac;
  OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
  local_a8;
  ulong local_80;
  Fault local_78;
  uchar *local_70;
  ArrayPtr<const_unsigned_char> *local_68;
  ArrayPtr<const_unsigned_char> *local_60;
  size_t local_58;
  OwnPromiseNode local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  size_t extraout_RDX;
  
  uVar9 = moreData.size_;
  uVar6 = moreData.ptr;
  puVar7 = (uchar *)data.size_;
  this_00 = (BlockedRead *)data.ptr;
  bVar13 = (this_00->canceler).list.ptr == (AdapterBase *)0x0;
  local_78.exception._0_1_ = bVar13;
  if (!bVar13) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
              ((Fault *)&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0x3f0,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",
               (DebugExpression<bool> *)&local_78,(char (*) [16])"already pumping");
    kj::_::Debug::Fault::fatal((Fault *)&local_a8);
  }
  uVar2 = (this_00->capBuffer).tag;
  if (uVar2 == 2) {
    if ((*(long *)((long)&(this_00->capBuffer).field_1 + 8) != 0) && (fds.size_ != 0)) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[130]>
                ((Fault *)&local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                 ,0x404,FAILED,(char *)0x0,
                 "\"async pipe message was written with FDs attached, but corresponding read \" \"asked for streams, and we don\'t know how to convert here\""
                 ,(char (*) [130])
                  "async pipe message was written with FDs attached, but corresponding read asked for streams, and we don\'t know how to convert here"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_a8);
    }
  }
  else if (uVar2 == 1) {
    uVar10 = *(ulong *)((long)&(this_00->capBuffer).field_1 + 8);
    local_80 = fds.size_;
    if (fds.size_ < uVar10) {
      local_80 = uVar10;
    }
    local_70 = puVar7;
    local_68 = (ArrayPtr<const_unsigned_char> *)uVar6;
    local_60 = (ArrayPtr<const_unsigned_char> *)uVar9;
    local_58 = in_R9;
    local_50.ptr = (PromiseNode *)this;
    if (local_80 != 0) {
      uVar10 = 0;
      pBVar12 = this_00;
LAB_0048beef:
      do {
        iVar4 = dup(fds.ptr[uVar10]);
        if (iVar4 < 0) {
          uVar5 = kj::_::Debug::getOsErrorNumber(false);
          pBVar12 = (BlockedRead *)((ulong)pBVar12 & 0xffffffff);
          if (uVar5 != 0xffffffff) {
            pBVar12 = (BlockedRead *)(ulong)uVar5;
          }
          iVar11 = (int)pBVar12;
          if (uVar5 == 0xffffffff) goto LAB_0048beef;
        }
        else {
          iVar11 = 0;
        }
        if (iVar11 != 0) {
          local_78.exception = (Exception *)0x0;
          local_a8.tag = 0;
          local_a8._4_4_ = 0;
          local_a8.field_1._0_8_ = 0;
          kj::_::Debug::Fault::init
                    (&local_78,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                    );
          kj::_::Debug::Fault::fatal(&local_78);
        }
        lVar3 = *(long *)&(this_00->capBuffer).field_1;
        local_a8.tag = *(undefined4 *)(lVar3 + uVar10 * 4);
        *(undefined4 *)(lVar3 + uVar10 * 4) = 0xffffffff;
        *(int *)(lVar3 + uVar10 * 4) = iVar4;
        local_ac.fd = -1;
        OwnFd::~OwnFd((OwnFd *)&local_a8);
        OwnFd::~OwnFd(&local_ac);
        uVar10 = uVar10 + 1;
        pBVar12 = this_00;
      } while (uVar10 != local_80);
    }
    local_a8.field_1._0_8_ = local_80 * 4 + *(long *)&(this_00->capBuffer).field_1;
    local_a8.field_1._8_8_ = *(long *)((long)&(this_00->capBuffer).field_1 + 8) - local_80;
    local_a8.tag = 1;
    OneOf<kj::ArrayPtr<kj::OwnFd>,_kj::ArrayPtr<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
    ::operator=(&this_00->capBuffer,
                (OneOf<kj::ArrayPtr<kj::OwnFd>,_kj::ArrayPtr<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
                 *)&local_a8);
    if (local_a8.tag == 1) {
      local_a8._0_8_ = local_a8._0_8_ & 0xffffffff00000000;
    }
    if (local_a8.tag == 2) {
      local_a8._0_8_ = local_a8._0_8_ & 0xffffffff00000000;
    }
    psVar1 = &(this_00->readSoFar).capCount;
    *psVar1 = *psVar1 + local_80;
    uVar6 = local_68;
    puVar7 = local_70;
    this = (BlockedRead *)local_50.ptr;
    uVar9 = local_60;
    in_R9 = local_58;
  }
  data_00.size_ = uVar6;
  data_00.ptr = puVar7;
  moreData_01.size_ = in_R9;
  moreData_01.ptr = (ArrayPtr<const_unsigned_char> *)uVar9;
  writeImpl(&local_a8,this_00,data_00,moreData_01);
  uVar2 = local_a8.tag;
  uVar8 = extraout_RDX;
  if (local_a8.tag == 2) {
    uVar6 = local_a8.field_1._8_8_;
    uVar8 = local_a8.field_1._0_8_;
    uVar9 = local_a8.field_1._16_8_;
  }
  if (local_a8.tag == 1) {
    local_a8._0_8_ = local_a8._0_8_ & 0xffffffff00000000;
  }
  if (uVar2 == 2) {
    local_48 = 0;
    uStack_40 = 0;
    data_01.size_ = uVar8;
    data_01.ptr = (uchar *)this_00->pipe;
    moreData_00.size_ = uVar9;
    moreData_00.ptr = (ArrayPtr<const_unsigned_char> *)uVar6;
    AsyncPipe::writeWithFds((AsyncPipe *)this,data_01,moreData_00,(ArrayPtr<const_int>)ZEXT816(0));
  }
  else {
    if (uVar2 != 1) {
      kj::_::unreachable();
    }
    kj::_::readyNow();
    *(undefined8 *)this = local_a8._0_8_;
  }
  return (Promise<void>)(PromiseNode *)this;
}

Assistant:

TwoWayPipe newTwoWayPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}